

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

bool slang::syntax::SyntaxFacts::isPossibleStructMember(TokenKind kind)

{
  TokenKind in_DI;
  bool local_1;
  
  if ((in_DI == OpenParenthesis) || (in_DI == RandKeyword || in_DI == RandCKeyword)) {
    local_1 = true;
  }
  else {
    local_1 = isPossibleDataType(in_DI);
  }
  return local_1;
}

Assistant:

bool SyntaxFacts::isPossibleStructMember(TokenKind kind) {
    switch (kind) {
        case TokenKind::OpenParenthesis:
        case TokenKind::RandKeyword:
        case TokenKind::RandCKeyword:
            return true;
        default:
            return isPossibleDataType(kind);
    }
}